

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O1

void ucnv_MBCSToUnicodeWithOffsets_63(UConverterToUnicodeArgs *pArgs,UErrorCode *pErrorCode)

{
  byte *pbVar1;
  byte bVar2;
  uint8_t uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  UConverterSharedData *pUVar15;
  int32_t (*stateTable) [256];
  UChar *pUVar16;
  long lVar17;
  long lVar18;
  UBool UVar19;
  int8_t iVar20;
  UChar32 UVar21;
  uint8_t *puVar22;
  uint8_t *puVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  UChar UVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  int iVar32;
  int iVar33;
  UConverter *pUVar34;
  uint32_t uVar35;
  int32_t *piVar36;
  int32_t *piVar37;
  undefined8 in_R8;
  byte *pbVar38;
  byte *pbVar39;
  uint uVar40;
  int32_t iVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  byte *pbVar45;
  char cVar46;
  UConverter *targetLimit;
  uint uVar47;
  UChar *target;
  uint8_t *source;
  int32_t *offsets;
  UConverter *local_68;
  uint local_5c;
  uint16_t *local_58;
  UConverter *local_50;
  UConverterToUnicodeArgs *local_48;
  UErrorCode *local_40;
  byte *local_38;
  
  pUVar34 = pArgs->converter;
  if ('\0' < pUVar34->preToULength) {
    ucnv_extContinueMatchToU_63(pUVar34,pArgs,-1,pErrorCode);
    if (U_ZERO_ERROR < *pErrorCode) {
      return;
    }
    if (pUVar34->preToULength < '\0') {
      return;
    }
  }
  pUVar15 = pUVar34->sharedData;
  if ((pUVar15->mbcs).countStates == '\x01') {
    if (((pUVar15->mbcs).unicodeMask & 1) == 0) {
      pUVar34 = pArgs->converter;
      puVar22 = (uint8_t *)pArgs->source;
      local_58 = (uint16_t *)pArgs->sourceLimit;
      target = pArgs->target;
      offsets = pArgs->offsets;
      uVar31 = (ulong)((long)pArgs->targetLimit - (long)target) >> 1;
      lVar44 = *(long *)((pUVar34->sharedData->mbcs).sbcsIndex +
                        (ulong)(((byte)pUVar34->options & 0x10) >> 4) * 4 + -0x18);
      uVar24 = (int)local_58 - (int)puVar22;
      uVar26 = (ulong)uVar24;
      if ((int)uVar31 <= (int)uVar24) {
        uVar26 = uVar31 & 0xffffffff;
      }
      iVar32 = 0;
      source = puVar22;
      local_68 = pUVar34;
      local_48 = pArgs;
      local_40 = pErrorCode;
LAB_00346141:
      puVar23 = puVar22;
      if (0xf < (int)uVar26) {
        uVar31 = uVar26 >> 4;
        lVar43 = 0;
        lVar42 = 0;
        iVar28 = (int)uVar31;
        do {
          iVar33 = (int)uVar31;
          uVar24 = *(uint *)(lVar44 + (ulong)source[lVar43] * 4);
          target[lVar43] = (UChar)uVar24;
          uVar40 = *(uint *)(lVar44 + (ulong)source[lVar43 + 1] * 4);
          target[lVar43 + 1] = (UChar)uVar40;
          uVar25 = *(uint *)(lVar44 + (ulong)source[lVar43 + 2] * 4);
          target[lVar43 + 2] = (UChar)uVar25;
          uVar47 = *(uint *)(lVar44 + (ulong)source[lVar43 + 3] * 4);
          target[lVar43 + 3] = (UChar)uVar47;
          uVar30 = *(uint *)(lVar44 + (ulong)source[lVar43 + 4] * 4);
          target[lVar43 + 4] = (UChar)uVar30;
          uVar4 = *(uint *)(lVar44 + (ulong)source[lVar43 + 5] * 4);
          target[lVar43 + 5] = (UChar)uVar4;
          uVar5 = *(uint *)(lVar44 + (ulong)source[lVar43 + 6] * 4);
          target[lVar43 + 6] = (UChar)uVar5;
          uVar6 = *(uint *)(lVar44 + (ulong)source[lVar43 + 7] * 4);
          target[lVar43 + 7] = (UChar)uVar6;
          uVar7 = *(uint *)(lVar44 + (ulong)source[lVar43 + 8] * 4);
          target[lVar43 + 8] = (UChar)uVar7;
          uVar8 = *(uint *)(lVar44 + (ulong)source[lVar43 + 9] * 4);
          target[lVar43 + 9] = (UChar)uVar8;
          uVar9 = *(uint *)(lVar44 + (ulong)source[lVar43 + 10] * 4);
          target[lVar43 + 10] = (UChar)uVar9;
          uVar10 = *(uint *)(lVar44 + (ulong)source[lVar43 + 0xb] * 4);
          target[lVar43 + 0xb] = (UChar)uVar10;
          uVar11 = *(uint *)(lVar44 + (ulong)source[lVar43 + 0xc] * 4);
          target[lVar43 + 0xc] = (UChar)uVar11;
          uVar12 = *(uint *)(lVar44 + (ulong)source[lVar43 + 0xd] * 4);
          target[lVar43 + 0xd] = (UChar)uVar12;
          uVar13 = *(uint *)(lVar44 + (ulong)source[lVar43 + 0xe] * 4);
          target[lVar43 + 0xe] = (UChar)uVar13;
          lVar17 = lVar43 + 0x10;
          uVar14 = *(uint *)(lVar44 + (ulong)(source + lVar17)[-1] * 4);
          lVar18 = lVar42 + 0x20;
          target[lVar43 + 0xf] = (UChar)uVar14;
          if (-0x7ff00001 <
              (int)(uVar10 | uVar11 | uVar12 | uVar13 | uVar14 |
                   uVar6 | uVar7 | uVar8 | uVar9 |
                   uVar30 | uVar4 | uVar5 | uVar25 | uVar47 | uVar24 | uVar40)) {
            source = source + lVar43;
            goto LAB_00346414;
          }
          lVar42 = lVar42 + 0x20;
          lVar43 = lVar43 + 0x10;
          uVar31 = (ulong)(iVar33 - 1);
        } while (1 < iVar33);
        iVar33 = 0;
        source = source + lVar17;
        lVar42 = lVar18;
LAB_00346414:
        target = (UChar *)((long)target + lVar42);
        iVar28 = iVar28 - iVar33;
        uVar26 = (ulong)(uint)((int)uVar26 + iVar28 * -0x10);
        pUVar34 = local_68;
        pArgs = local_48;
        pErrorCode = local_40;
        if ((offsets != (int32_t *)0x0) && (puVar23 = puVar22 + iVar28 * 0x10, 0 < iVar28)) {
          iVar28 = iVar28 + 1;
          iVar33 = iVar32;
          do {
            *offsets = iVar33;
            offsets[1] = iVar33 + 1;
            offsets[2] = iVar33 + 2;
            offsets[3] = iVar33 + 3;
            offsets[4] = iVar33 + 4;
            offsets[5] = iVar33 + 5;
            offsets[6] = iVar33 + 6;
            offsets[7] = iVar33 + 7;
            offsets[8] = iVar33 + 8;
            offsets[9] = iVar33 + 9;
            offsets[10] = iVar33 + 10;
            offsets[0xb] = iVar33 + 0xb;
            offsets[0xc] = iVar33 + 0xc;
            offsets[0xd] = iVar33 + 0xd;
            offsets[0xe] = iVar33 + 0xe;
            iVar32 = iVar33 + 0x10;
            offsets[0xf] = iVar33 + 0xf;
            offsets = offsets + 0x10;
            iVar28 = iVar28 + -1;
            iVar33 = iVar32;
          } while (1 < iVar28);
        }
      }
      puVar22 = source;
      if (0 < (int)uVar26) {
        do {
          iVar33 = (int)source + -1;
          iVar28 = (int)source - (int)puVar23;
          puVar22 = source;
LAB_00346504:
          source = puVar22;
          iVar29 = iVar28;
          puVar22 = source;
          if (local_58 <= source) break;
          puVar22 = source + 1;
          uVar24 = *(uint *)(lVar44 + (ulong)*source * 4);
          if ((-0x7ff00001 < (int)uVar24) && (uVar40 = uVar24 >> 0x14 & 0xf, uVar40 != 2)) {
            iVar28 = iVar29 + 1;
            iVar33 = iVar33 + 1;
            if (uVar40 != 6) goto code_r0x00346542;
            goto LAB_00346575;
          }
          pUVar16 = target + 1;
          *target = (UChar)uVar24;
          iVar28 = (int)uVar26;
          uVar26 = (ulong)(iVar28 - 1);
          target = pUVar16;
          source = puVar22;
        } while (1 < iVar28);
      }
      goto LAB_00346fa2;
    }
    local_68 = pArgs->converter;
    source = (uint8_t *)pArgs->source;
    puVar23 = (uint8_t *)pArgs->sourceLimit;
    target = pArgs->target;
    pUVar16 = pArgs->targetLimit;
    offsets = pArgs->offsets;
    puVar22 = source;
    if (source < puVar23) {
      local_58 = *(uint16_t **)
                  ((local_68->sharedData->mbcs).sbcsIndex +
                  (ulong)(((byte)local_68->options & 0x10) >> 4) * 4 + -0x18);
      iVar32 = 0;
      do {
        if (pUVar16 <= target) {
LAB_003470b5:
          *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
          puVar22 = source;
          break;
        }
        puVar22 = source + 1;
        uVar24 = *(uint *)((long)local_58 + (ulong)*source * 4);
        if ((int)uVar24 < -0x7ff00000) {
LAB_00346e29:
          *target = (UChar)uVar24;
          target = target + 1;
LAB_00346ea8:
          source = puVar22;
          if (offsets != (int32_t *)0x0) {
            *offsets = iVar32;
            offsets = offsets + 1;
          }
        }
        else {
          if ((uVar24 & 0xd00000) == 0x100000) {
            *target = (ushort)(uVar24 >> 10) & 0x3ff | 0xd800;
            if (offsets != (int32_t *)0x0) {
              *offsets = iVar32;
              offsets = offsets + 1;
            }
            UVar27 = (UChar)uVar24 & 0x3ffU | 0xdc00;
            if (pUVar16 <= target + 1) {
              local_68->UCharErrorBuffer[0] = UVar27;
              local_68->UCharErrorBufferLength = '\x01';
              target = target + 1;
              source = puVar22;
              goto LAB_003470b5;
            }
            target[1] = UVar27;
            target = target + 2;
            goto LAB_00346ea8;
          }
          uVar40 = uVar24 >> 0x14 & 0xf;
          if (uVar40 == 7) {
            *pErrorCode = U_ILLEGAL_CHAR_FOUND;
LAB_00346efe:
            if (U_ZERO_ERROR < *pErrorCode) break;
            pArgs->source = (char *)puVar22;
            local_68->toUBytes[0] = *source;
            piVar36 = (local_68->sharedData->mbcs).extIndexes;
            source = puVar22;
            if ((piVar36 == (int32_t *)0x0) ||
               (UVar19 = ucnv_extInitialMatchToU_63
                                   (local_68,piVar36,1,(char **)&source,(char *)puVar23,&target,
                                    pUVar16,&offsets,iVar32,pArgs->flush,pErrorCode), UVar19 == '\0'
               )) {
              *pErrorCode = U_INVALID_CHAR_FOUND;
              iVar20 = '\x01';
            }
            else {
              iVar20 = '\0';
            }
            local_68->toULength = iVar20;
            puVar22 = source;
            if (U_ZERO_ERROR < *pErrorCode) break;
            iVar32 = iVar32 + ((int)source - *(int *)&pArgs->source);
          }
          else {
            if (uVar40 == 6) goto LAB_00346efe;
            source = puVar22;
            if (uVar40 == 2) goto LAB_00346e29;
          }
        }
        iVar32 = iVar32 + 1;
        puVar22 = source;
      } while (source < puVar23);
    }
    goto LAB_00347013;
  }
  source = (uint8_t *)pArgs->source;
  pbVar45 = (byte *)pArgs->sourceLimit;
  target = pArgs->target;
  targetLimit = (UConverter *)pArgs->targetLimit;
  offsets = pArgs->offsets;
  uVar24 = pUVar34->mode;
  if ((char)uVar24 == '\0') {
    uVar24 = (uint)(pUVar15->mbcs).dbcsOnlyState;
  }
  pbVar39 = (byte *)CONCAT71((int7)((ulong)in_R8 >> 8),pUVar34->toULength);
  uVar35 = pUVar34->toUnicodeStatus;
  if (source < pbVar45) {
    stateTable = *(int32_t (**) [256])
                  ((pUVar15->mbcs).sbcsIndex +
                  (ulong)(((byte)pUVar34->options & 0x10) >> 4) * 4 + -0x18);
    local_58 = (pUVar15->mbcs).unicodeCodeUnits;
    uVar40 = 0;
    local_68 = (UConverter *)(ulong)-(uint)(pUVar34->toULength != '\0');
    local_50 = pUVar34;
    local_38 = pbVar45;
    do {
      if (targetLimit <= target) {
LAB_00346ff6:
        *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
        break;
      }
      if ((char)pbVar39 == '\0') {
        piVar36 = offsets;
        pbVar38 = pbVar39;
        if (offsets == (int32_t *)0x0) {
          do {
            uVar25 = *(uint *)((long)*stateTable +
                              (ulong)*source * 4 + (ulong)((uVar24 & 0xff) << 10));
            if ((int)uVar25 < 0) {
              if (-0x7ff00001 < (int)uVar25) goto LAB_00346913;
              source = source + 1;
              *target = (UChar)uVar25;
              uVar24 = 0;
            }
            else {
              uVar24 = uVar25 >> 0x18;
              uVar35 = uVar25 & 0xffffff;
              pbVar1 = source + 1;
              puVar22 = source;
              if (((pbVar45 <= pbVar1) ||
                  (uVar25 = *(uint *)((long)*stateTable + (ulong)*pbVar1 * 4 + (ulong)(uVar24 << 10)
                                     ), (uVar25 & 0x80f00000) != 0x80400000)) ||
                 (0xfffd < local_58[(uVar25 & 0xffff) + uVar35])) goto LAB_0034690b;
              source = source + 2;
              *target = local_58[(uVar25 & 0xffff) + uVar35];
              uVar24 = (uint)((byte)(uVar25 >> 0x18) & 0x7f);
              uVar35 = 0;
            }
            target = target + 1;
            if ((pbVar45 <= source) || (targetLimit <= target)) goto LAB_00346913;
          } while( true );
        }
        do {
          uVar25 = *(uint *)((long)*stateTable + (ulong)*source * 4 + (ulong)((uVar24 & 0xff) << 10)
                            );
          piVar37 = piVar36;
          if (-1 < (int)uVar25) {
            uVar24 = uVar25 >> 0x18;
            uVar35 = uVar25 & 0xffffff;
            pbVar1 = source + 1;
            pbVar39 = pbVar1;
            if (pbVar1 < pbVar45) {
              uVar25 = *(uint *)((long)*stateTable + (ulong)*pbVar1 * 4 + (ulong)(uVar24 << 10));
              pbVar39 = (byte *)(ulong)(uVar25 & 0x80f00000);
              if ((uVar25 & 0x80f00000) == 0x80400000) {
                UVar27 = local_58[(uVar25 & 0xffff) + uVar35];
                pbVar39 = (byte *)(ulong)(ushort)UVar27;
                if ((ushort)UVar27 < 0xfffe) {
                  source = source + 2;
                  *target = UVar27;
                  if (piVar36 != (int32_t *)0x0) {
                    piVar37 = piVar36 + 1;
                    *piVar36 = (int32_t)local_68;
                    uVar40 = uVar40 + 2;
                    local_68 = (UConverter *)(ulong)uVar40;
                    offsets = piVar37;
                  }
                  uVar24 = (uint)((byte)(uVar25 >> 0x18) & 0x7f);
                  uVar35 = 0;
                  goto LAB_00346831;
                }
              }
            }
            uVar40 = uVar40 + 1;
            puVar22 = source;
LAB_0034690b:
            source = pbVar1;
            pUVar34->toUBytes[0] = *puVar22;
            pbVar39 = (byte *)CONCAT71((int7)((ulong)pbVar39 >> 8),1);
LAB_00346913:
            if (source < pbVar45) {
              if (targetLimit <= target) goto LAB_00346ff6;
              pUVar34->toUBytes[(ulong)pbVar39 & 0xff] = *source;
              goto LAB_0034693f;
            }
            goto LAB_00347000;
          }
          if (-0x7ff00001 < (int)uVar25) {
            pbVar39 = (byte *)((ulong)pbVar38 & 0xffffffff);
            goto LAB_00346913;
          }
          source = source + 1;
          *target = (UChar)uVar25;
          if (piVar36 != (int32_t *)0x0) {
            offsets = piVar36 + 1;
            *piVar36 = (int32_t)local_68;
            uVar40 = uVar40 + 1;
            local_68 = (UConverter *)(ulong)uVar40;
            piVar37 = offsets;
          }
          uVar24 = 0;
LAB_00346831:
          target = target + 1;
          pbVar39 = (byte *)((ulong)pbVar38 & 0xffffffff);
          if ((pbVar45 <= source) || (piVar36 = piVar37, pbVar38 = pbVar39, targetLimit <= target))
          goto LAB_00346913;
        } while( true );
      }
      bVar2 = *source;
      pUVar34->toUBytes[(char)pbVar39] = bVar2;
      uVar25 = *(uint *)((long)*stateTable + (ulong)bVar2 * 4 + (ulong)((uVar24 & 0xff) << 10));
LAB_0034693f:
      source = source + 1;
      pbVar39 = (byte *)CONCAT71((int7)((ulong)pbVar39 >> 8),(char)pbVar39 + '\x01');
      uVar40 = uVar40 + 1;
      if ((int)uVar25 < 0) {
        pUVar34->mode = uVar24 & 0xff;
        uVar47 = (uint)((byte)(uVar25 >> 0x18) & 0x7f);
        uVar30 = uVar25 >> 0x14 & 0xf;
        iVar41 = (int32_t)local_68;
        if (uVar30 == 0) {
switchD_00346b2a_caseD_2:
          *target = (UChar)uVar25;
          target = target + 1;
LAB_00346b3d:
          if (offsets != (int32_t *)0x0) {
            *offsets = iVar41;
            offsets = offsets + 1;
          }
switchD_00346b2a_caseD_3:
          pbVar39 = (byte *)0x0;
switchD_00346b2a_caseD_6:
        }
        else {
          if (uVar30 == 5) {
            UVar27 = local_58[uVar35 + (uVar25 & 0xffff)];
            if ((ushort)UVar27 < 0xd800) {
              *target = UVar27;
              target = target + 1;
            }
            else {
              uVar24 = (uVar25 & 0xffff) + uVar35 + 1;
              if (0xdfff < (ushort)UVar27) {
                if ((UVar27 & 0xfffeU) == 0xe000) {
                  UVar27 = local_58[uVar24];
                  goto LAB_0034699d;
                }
                if (UVar27 == L'\xffff') goto LAB_00346cdd;
                goto LAB_00346b61;
              }
              *target = UVar27 & 0xdbff;
              if (offsets != (int32_t *)0x0) {
                *offsets = iVar41;
                offsets = offsets + 1;
              }
              if (targetLimit <= target + 1) {
                pUVar34->UCharErrorBuffer[0] = local_58[uVar24];
                goto LAB_0034716c;
              }
              target[1] = local_58[uVar24];
              target = target + 2;
            }
            goto LAB_00346b3d;
          }
          if (uVar30 != 4) {
            if ((uVar25 & 0xd00000) != 0x100000) {
              switch(uVar30) {
              case 2:
                goto switchD_00346b2a_caseD_2;
              default:
                goto switchD_00346b2a_caseD_3;
              case 6:
                break;
              case 7:
                *pErrorCode = U_ILLEGAL_CHAR_FOUND;
                break;
              case 8:
                if ((pUVar34->sharedData->mbcs).dbcsOnlyState == '\0')
                goto switchD_00346b2a_caseD_3;
                *pErrorCode = U_ILLEGAL_CHAR_FOUND;
                uVar47 = uVar24;
              }
              goto switchD_00346b2a_caseD_6;
            }
            *target = (ushort)(uVar25 >> 10) & 0x3ff | 0xd800;
            if (offsets != (int32_t *)0x0) {
              *offsets = iVar41;
              offsets = offsets + 1;
            }
            UVar27 = (UChar)uVar25 & 0x3ffU | 0xdc00;
            if (target + 1 < targetLimit) {
              target[1] = UVar27;
              target = target + 2;
              goto LAB_00346b3d;
            }
            pUVar34->UCharErrorBuffer[0] = UVar27;
LAB_0034716c:
            target = target + 1;
            pUVar34->UCharErrorBufferLength = '\x01';
            *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
            pbVar39 = (byte *)0x0;
            uVar35 = 0;
            uVar24 = uVar47;
            break;
          }
          uVar24 = uVar35 + (uVar25 & 0xffff);
          UVar27 = local_58[uVar24];
          if ((ushort)UVar27 < 0xfffe) {
LAB_0034699d:
            *target = UVar27;
            target = target + 1;
            goto LAB_00346b3d;
          }
          if (UVar27 == L'\xfffe') {
            local_5c = (uint)pbVar39;
            local_48 = pArgs;
            UVar21 = ucnv_MBCSGetFallback(&pUVar34->sharedData->mbcs,uVar24);
            pUVar34 = local_50;
            pArgs = local_48;
            if (UVar21 == 0xfffe) {
              pbVar39 = (byte *)(ulong)local_5c;
            }
            else {
              *target = (UChar)UVar21;
              if (offsets != (int32_t *)0x0) {
                *offsets = (int32_t)local_68;
                offsets = offsets + 1;
              }
              pbVar39 = (byte *)0x0;
              target = target + 1;
            }
          }
          else {
LAB_00346cdd:
            *pErrorCode = U_ILLEGAL_CHAR_FOUND;
          }
        }
LAB_00346b61:
        cVar46 = (char)pbVar39;
        uVar24 = uVar47;
        if (cVar46 != '\0') {
          uVar25 = (uint)pbVar39;
          if (U_ZERO_ERROR < *pErrorCode) {
            pbVar39 = (byte *)((ulong)pbVar39 & 0xff);
            if ('\x01' < cVar46) {
              uVar3 = (pUVar34->sharedData->mbcs).dbcsOnlyState;
              local_68 = (UConverter *)(pbVar39 + -1);
              pbVar45 = (byte *)0x0;
              local_5c = uVar25;
              local_48 = pArgs;
              goto LAB_00347071;
            }
            uVar35 = 0;
            break;
          }
          pArgs->source = (char *)source;
          piVar36 = (pUVar34->sharedData->mbcs).extIndexes;
          if (piVar36 == (int32_t *)0x0) {
LAB_00346c15:
            if (((char)pbVar39 == '\x04') && ((pUVar34->options & 0x8000) != 0)) {
              uVar25 = (uint)pUVar34->toUBytes[3] +
                       ((uint)pUVar34->toUBytes[2] * 5 +
                       ((uint)pUVar34->toUBytes[1] +
                       ((uint)pUVar34->toUBytes[0] + (uint)pUVar34->toUBytes[0] * 4) * 2) * 0x276) *
                       2;
              lVar44 = 0xc;
              do {
                uVar47 = *(uint *)(&UNK_003ea0bc + lVar44);
                if ((*(uint *)(&UNK_003ea0bc + lVar44) <= uVar25) &&
                   (uVar25 <= *(uint *)((long)gb18030Ranges[0] + lVar44))) {
                  *pErrorCode = U_ZERO_ERROR;
                  iVar41 = (int32_t)local_68;
                  local_68 = targetLimit;
                  ucnv_toUWriteCodePoint_63
                            (pUVar34,(uVar25 - uVar47) + *(int *)("" + lVar44 + 0xe),&target,
                             (UChar *)targetLimit,&offsets,iVar41,pErrorCode);
                  targetLimit = local_68;
                  goto LAB_00346c0c;
                }
                lVar44 = lVar44 + 0x10;
              } while ((int)lVar44 != 0xec);
            }
            *pErrorCode = U_INVALID_CHAR_FOUND;
          }
          else {
            local_5c = uVar25;
            UVar19 = ucnv_extInitialMatchToU_63
                               (pUVar34,piVar36,(int)cVar46,(char **)&source,(char *)pbVar45,&target
                                ,(UChar *)targetLimit,&offsets,(int32_t)local_68,pArgs->flush,
                                pErrorCode);
            pbVar39 = (byte *)(ulong)local_5c;
            pUVar34 = local_50;
            pbVar45 = local_38;
            if (UVar19 == '\0') goto LAB_00346c15;
LAB_00346c0c:
            pbVar39 = (byte *)0x0;
            pUVar34 = local_50;
          }
          uVar35 = 0;
          if (U_ZERO_ERROR < *pErrorCode) break;
          uVar40 = uVar40 + ((int)source - *(int *)&pArgs->source);
        }
        uVar35 = 0;
        local_68 = (UConverter *)(ulong)uVar40;
      }
      else {
        uVar35 = uVar35 + (uVar25 & 0xffffff);
        uVar24 = uVar25 >> 0x18;
      }
    } while (source < pbVar45);
  }
  goto LAB_00347000;
code_r0x00346542:
  if (uVar40 != 7) goto LAB_00346504;
  *pErrorCode = U_ILLEGAL_CHAR_FOUND;
LAB_00346575:
  if ((offsets != (int32_t *)0x0) && (1 < iVar28)) {
    iVar29 = iVar29 + 2;
    do {
      *offsets = iVar32;
      offsets = offsets + 1;
      iVar32 = iVar32 + 1;
      iVar29 = iVar29 + -1;
    } while (2 < iVar29);
  }
  if (U_ZERO_ERROR < *pErrorCode) goto LAB_00346fa2;
  pUVar34->toUBytes[0] = *source;
  piVar36 = (pUVar34->sharedData->mbcs).extIndexes;
  source = puVar22;
  if ((piVar36 == (int32_t *)0x0) ||
     (UVar19 = ucnv_extInitialMatchToU_63
                         (pUVar34,piVar36,1,(char **)&source,(char *)local_58,&target,
                          pArgs->targetLimit,&offsets,iVar32,pArgs->flush,pErrorCode),
     pUVar34 = local_68, UVar19 == '\0')) {
    *pErrorCode = U_INVALID_CHAR_FOUND;
    iVar20 = '\x01';
  }
  else {
    iVar20 = '\0';
  }
  pUVar34->toULength = iVar20;
  iVar28 = (int)source;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar32 = (iVar32 + iVar28) - iVar33;
    uVar31 = (ulong)((long)pArgs->targetLimit - (long)target) >> 1;
    uVar24 = (int)local_58 - iVar28;
    uVar26 = (ulong)uVar24;
    if ((int)uVar31 <= (int)uVar24) {
      uVar26 = uVar31 & 0xffffffff;
    }
    goto LAB_00346141;
  }
  iVar32 = (iVar32 + iVar28) - iVar33;
  puVar23 = puVar22;
  puVar22 = source;
LAB_00346fa2:
  source = puVar22;
  if ((source < local_58 && *pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
     (pArgs->targetLimit <= target)) {
    *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
  }
  puVar22 = source;
  if ((offsets != (int32_t *)0x0) && (source != puVar23)) {
    lVar44 = (long)puVar23 - (long)source;
    do {
      *offsets = iVar32;
      offsets = offsets + 1;
      iVar32 = iVar32 + 1;
      lVar44 = lVar44 + 1;
    } while (lVar44 != 0);
  }
  goto LAB_00347013;
  while (pbVar45 = pbVar45 + 1, local_68 != (UConverter *)pbVar45) {
LAB_00347071:
    UVar19 = isSingleOrLead(stateTable,(uint8_t)uVar47,uVar3 != '\0',
                            (local_50->toUBytes + 1)[(long)pbVar45]);
    pUVar34 = local_50;
    if (UVar19 != '\0') {
      cVar46 = (cVar46 - (char)pbVar45) + -1;
      lVar44 = (long)source - (long)local_48->source;
      if ((int)lVar44 < (int)cVar46) {
        cVar46 = ('\x01' - (char)local_5c) + (char)pbVar45 + (char)lVar44;
        local_50->preToULength = cVar46;
        memcpy(local_50->preToU,pbVar45 + 0x42 + (long)local_50,-(long)cVar46);
        source = (uint8_t *)local_48->source;
      }
      else {
        source = source + -(long)cVar46;
      }
      uVar35 = 0;
      pbVar39 = (byte *)((ulong)(pbVar45 + 1) & 0xffffffff);
      pArgs = local_48;
      goto LAB_00347000;
    }
  }
  uVar35 = 0;
  pArgs = local_48;
LAB_00347000:
  pUVar34->toUnicodeStatus = uVar35;
  pUVar34->mode = uVar24 & 0xff;
  pUVar34->toULength = (int8_t)pbVar39;
  puVar22 = source;
LAB_00347013:
  pArgs->source = (char *)puVar22;
  pArgs->target = target;
  pArgs->offsets = offsets;
  return;
}

Assistant:

U_CFUNC void
ucnv_MBCSToUnicodeWithOffsets(UConverterToUnicodeArgs *pArgs,
                          UErrorCode *pErrorCode) {
    UConverter *cnv;
    const uint8_t *source, *sourceLimit;
    UChar *target;
    const UChar *targetLimit;
    int32_t *offsets;

    const int32_t (*stateTable)[256];
    const uint16_t *unicodeCodeUnits;

    uint32_t offset;
    uint8_t state;
    int8_t byteIndex;
    uint8_t *bytes;

    int32_t sourceIndex, nextSourceIndex;

    int32_t entry;
    UChar c;
    uint8_t action;

    /* use optimized function if possible */
    cnv=pArgs->converter;

    if(cnv->preToULength>0) {
        /*
         * pass sourceIndex=-1 because we continue from an earlier buffer
         * in the future, this may change with continuous offsets
         */
        ucnv_extContinueMatchToU(cnv, pArgs, -1, pErrorCode);

        if(U_FAILURE(*pErrorCode) || cnv->preToULength<0) {
            return;
        }
    }

    if(cnv->sharedData->mbcs.countStates==1) {
        if(!(cnv->sharedData->mbcs.unicodeMask&UCNV_HAS_SUPPLEMENTARY)) {
            ucnv_MBCSSingleToBMPWithOffsets(pArgs, pErrorCode);
        } else {
            ucnv_MBCSSingleToUnicodeWithOffsets(pArgs, pErrorCode);
        }
        return;
    }

    /* set up the local pointers */
    source=(const uint8_t *)pArgs->source;
    sourceLimit=(const uint8_t *)pArgs->sourceLimit;
    target=pArgs->target;
    targetLimit=pArgs->targetLimit;
    offsets=pArgs->offsets;

    if((cnv->options&UCNV_OPTION_SWAP_LFNL)!=0) {
        stateTable=(const int32_t (*)[256])cnv->sharedData->mbcs.swapLFNLStateTable;
    } else {
        stateTable=cnv->sharedData->mbcs.stateTable;
    }
    unicodeCodeUnits=cnv->sharedData->mbcs.unicodeCodeUnits;

    /* get the converter state from UConverter */
    offset=cnv->toUnicodeStatus;
    byteIndex=cnv->toULength;
    bytes=cnv->toUBytes;

    /*
     * if we are in the SBCS state for a DBCS-only converter,
     * then load the DBCS state from the MBCS data
     * (dbcsOnlyState==0 if it is not a DBCS-only converter)
     */
    if((state=(uint8_t)(cnv->mode))==0) {
        state=cnv->sharedData->mbcs.dbcsOnlyState;
    }

    /* sourceIndex=-1 if the current character began in the previous buffer */
    sourceIndex=byteIndex==0 ? 0 : -1;
    nextSourceIndex=0;

    /* conversion loop */
    while(source<sourceLimit) {
        /*
         * This following test is to see if available input would overflow the output.
         * It does not catch output of more than one code unit that
         * overflows as a result of a surrogate pair or callback output
         * from the last source byte.
         * Therefore, those situations also test for overflows and will
         * then break the loop, too.
         */
        if(target>=targetLimit) {
            /* target is full */
            *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
            break;
        }

        if(byteIndex==0) {
            /* optimized loop for 1/2-byte input and BMP output */
            if(offsets==NULL) {
                do {
                    entry=stateTable[state][*source];
                    if(MBCS_ENTRY_IS_TRANSITION(entry)) {
                        state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
                        offset=MBCS_ENTRY_TRANSITION_OFFSET(entry);

                        ++source;
                        if( source<sourceLimit &&
                            MBCS_ENTRY_IS_FINAL(entry=stateTable[state][*source]) &&
                            MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_VALID_16 &&
                            (c=unicodeCodeUnits[offset+MBCS_ENTRY_FINAL_VALUE_16(entry)])<0xfffe
                        ) {
                            ++source;
                            *target++=c;
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                            offset=0;
                        } else {
                            /* set the state and leave the optimized loop */
                            bytes[0]=*(source-1);
                            byteIndex=1;
                            break;
                        }
                    } else {
                        if(MBCS_ENTRY_FINAL_IS_VALID_DIRECT_16(entry)) {
                            /* output BMP code point */
                            ++source;
                            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                        } else {
                            /* leave the optimized loop */
                            break;
                        }
                    }
                } while(source<sourceLimit && target<targetLimit);
            } else /* offsets!=NULL */ {
                do {
                    entry=stateTable[state][*source];
                    if(MBCS_ENTRY_IS_TRANSITION(entry)) {
                        state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
                        offset=MBCS_ENTRY_TRANSITION_OFFSET(entry);

                        ++source;
                        if( source<sourceLimit &&
                            MBCS_ENTRY_IS_FINAL(entry=stateTable[state][*source]) &&
                            MBCS_ENTRY_FINAL_ACTION(entry)==MBCS_STATE_VALID_16 &&
                            (c=unicodeCodeUnits[offset+MBCS_ENTRY_FINAL_VALUE_16(entry)])<0xfffe
                        ) {
                            ++source;
                            *target++=c;
                            if(offsets!=NULL) {
                                *offsets++=sourceIndex;
                                sourceIndex=(nextSourceIndex+=2);
                            }
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                            offset=0;
                        } else {
                            /* set the state and leave the optimized loop */
                            ++nextSourceIndex;
                            bytes[0]=*(source-1);
                            byteIndex=1;
                            break;
                        }
                    } else {
                        if(MBCS_ENTRY_FINAL_IS_VALID_DIRECT_16(entry)) {
                            /* output BMP code point */
                            ++source;
                            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                            if(offsets!=NULL) {
                                *offsets++=sourceIndex;
                                sourceIndex=++nextSourceIndex;
                            }
                            state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */
                        } else {
                            /* leave the optimized loop */
                            break;
                        }
                    }
                } while(source<sourceLimit && target<targetLimit);
            }

            /*
             * these tests and break statements could be put inside the loop
             * if C had "break outerLoop" like Java
             */
            if(source>=sourceLimit) {
                break;
            }
            if(target>=targetLimit) {
                /* target is full */
                *pErrorCode=U_BUFFER_OVERFLOW_ERROR;
                break;
            }

            ++nextSourceIndex;
            bytes[byteIndex++]=*source++;
        } else /* byteIndex>0 */ {
            ++nextSourceIndex;
            entry=stateTable[state][bytes[byteIndex++]=*source++];
        }

        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            state=(uint8_t)MBCS_ENTRY_TRANSITION_STATE(entry);
            offset+=MBCS_ENTRY_TRANSITION_OFFSET(entry);
            continue;
        }

        /* save the previous state for proper extension mapping with SI/SO-stateful converters */
        cnv->mode=state;

        /* set the next state early so that we can reuse the entry variable */
        state=(uint8_t)MBCS_ENTRY_FINAL_STATE(entry); /* typically 0 */

        /*
         * An if-else-if chain provides more reliable performance for
         * the most common cases compared to a switch.
         */
        action=(uint8_t)(MBCS_ENTRY_FINAL_ACTION(entry));
        if(action==MBCS_STATE_VALID_16) {
            offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
            c=unicodeCodeUnits[offset];
            if(c<0xfffe) {
                /* output BMP code point */
                *target++=c;
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            } else if(c==0xfffe) {
                if(UCNV_TO_U_USE_FALLBACK(cnv) && (entry=(int32_t)ucnv_MBCSGetFallback(&cnv->sharedData->mbcs, offset))!=0xfffe) {
                    /* output fallback BMP code point */
                    *target++=(UChar)entry;
                    if(offsets!=NULL) {
                        *offsets++=sourceIndex;
                    }
                    byteIndex=0;
                }
            } else {
                /* callback(illegal) */
                *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            }
        } else if(action==MBCS_STATE_VALID_DIRECT_16) {
            /* output BMP code point */
            *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            if(offsets!=NULL) {
                *offsets++=sourceIndex;
            }
            byteIndex=0;
        } else if(action==MBCS_STATE_VALID_16_PAIR) {
            offset+=MBCS_ENTRY_FINAL_VALUE_16(entry);
            c=unicodeCodeUnits[offset++];
            if(c<0xd800) {
                /* output BMP code point below 0xd800 */
                *target++=c;
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? c<=0xdfff : c<=0xdbff) {
                /* output roundtrip or fallback surrogate pair */
                *target++=(UChar)(c&0xdbff);
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
                if(target<targetLimit) {
                    *target++=unicodeCodeUnits[offset];
                    if(offsets!=NULL) {
                        *offsets++=sourceIndex;
                    }
                } else {
                    /* target overflow */
                    cnv->UCharErrorBuffer[0]=unicodeCodeUnits[offset];
                    cnv->UCharErrorBufferLength=1;
                    *pErrorCode=U_BUFFER_OVERFLOW_ERROR;

                    offset=0;
                    break;
                }
            } else if(UCNV_TO_U_USE_FALLBACK(cnv) ? (c&0xfffe)==0xe000 : c==0xe000) {
                /* output roundtrip BMP code point above 0xd800 or fallback BMP code point */
                *target++=unicodeCodeUnits[offset];
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            } else if(c==0xffff) {
                /* callback(illegal) */
                *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            }
        } else if(action==MBCS_STATE_VALID_DIRECT_20 ||
                  (action==MBCS_STATE_FALLBACK_DIRECT_20 && UCNV_TO_U_USE_FALLBACK(cnv))
        ) {
            entry=MBCS_ENTRY_FINAL_VALUE(entry);
            /* output surrogate pair */
            *target++=(UChar)(0xd800|(UChar)(entry>>10));
            if(offsets!=NULL) {
                *offsets++=sourceIndex;
            }
            byteIndex=0;
            c=(UChar)(0xdc00|(UChar)(entry&0x3ff));
            if(target<targetLimit) {
                *target++=c;
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
            } else {
                /* target overflow */
                cnv->UCharErrorBuffer[0]=c;
                cnv->UCharErrorBufferLength=1;
                *pErrorCode=U_BUFFER_OVERFLOW_ERROR;

                offset=0;
                break;
            }
        } else if(action==MBCS_STATE_CHANGE_ONLY) {
            /*
             * This serves as a state change without any output.
             * It is useful for reading simple stateful encodings,
             * for example using just Shift-In/Shift-Out codes.
             * The 21 unused bits may later be used for more sophisticated
             * state transitions.
             */
            if(cnv->sharedData->mbcs.dbcsOnlyState==0) {
                byteIndex=0;
            } else {
                /* SI/SO are illegal for DBCS-only conversion */
                state=(uint8_t)(cnv->mode); /* restore the previous state */

                /* callback(illegal) */
                *pErrorCode=U_ILLEGAL_CHAR_FOUND;
            }
        } else if(action==MBCS_STATE_FALLBACK_DIRECT_16) {
            if(UCNV_TO_U_USE_FALLBACK(cnv)) {
                /* output BMP code point */
                *target++=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
                if(offsets!=NULL) {
                    *offsets++=sourceIndex;
                }
                byteIndex=0;
            }
        } else if(action==MBCS_STATE_UNASSIGNED) {
            /* just fall through */
        } else if(action==MBCS_STATE_ILLEGAL) {
            /* callback(illegal) */
            *pErrorCode=U_ILLEGAL_CHAR_FOUND;
        } else {
            /* reserved, must never occur */
            byteIndex=0;
        }

        /* end of action codes: prepare for a new character */
        offset=0;

        if(byteIndex==0) {
            sourceIndex=nextSourceIndex;
        } else if(U_FAILURE(*pErrorCode)) {
            /* callback(illegal) */
            if(byteIndex>1) {
                /*
                 * Ticket 5691: consistent illegal sequences:
                 * - We include at least the first byte in the illegal sequence.
                 * - If any of the non-initial bytes could be the start of a character,
                 *   we stop the illegal sequence before the first one of those.
                 */
                UBool isDBCSOnly=(UBool)(cnv->sharedData->mbcs.dbcsOnlyState!=0);
                int8_t i;
                for(i=1;
                    i<byteIndex && !isSingleOrLead(stateTable, state, isDBCSOnly, bytes[i]);
                    ++i) {}
                if(i<byteIndex) {
                    /* Back out some bytes. */
                    int8_t backOutDistance=byteIndex-i;
                    int32_t bytesFromThisBuffer=(int32_t)(source-(const uint8_t *)pArgs->source);
                    byteIndex=i;  /* length of reported illegal byte sequence */
                    if(backOutDistance<=bytesFromThisBuffer) {
                        source-=backOutDistance;
                    } else {
                        /* Back out bytes from the previous buffer: Need to replay them. */
                        cnv->preToULength=(int8_t)(bytesFromThisBuffer-backOutDistance);
                        /* preToULength is negative! */
                        uprv_memcpy(cnv->preToU, bytes+i, -cnv->preToULength);
                        source=(const uint8_t *)pArgs->source;
                    }
                }
            }
            break;
        } else /* unassigned sequences indicated with byteIndex>0 */ {
            /* try an extension mapping */
            pArgs->source=(const char *)source;
            byteIndex=_extToU(cnv, cnv->sharedData,
                              byteIndex, &source, sourceLimit,
                              &target, targetLimit,
                              &offsets, sourceIndex,
                              pArgs->flush,
                              pErrorCode);
            sourceIndex=nextSourceIndex+=(int32_t)(source-(const uint8_t *)pArgs->source);

            if(U_FAILURE(*pErrorCode)) {
                /* not mappable or buffer overflow */
                break;
            }
        }
    }

    /* set the converter state back into UConverter */
    cnv->toUnicodeStatus=offset;
    cnv->mode=state;
    cnv->toULength=byteIndex;

    /* write back the updated pointers */
    pArgs->source=(const char *)source;
    pArgs->target=target;
    pArgs->offsets=offsets;
}